

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::LoadCache(cmake *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_71;
  string local_70 [8];
  string cacheFile;
  allocator local_39;
  string local_38;
  cmake *local_18;
  cmake *this_local;
  
  local_18 = this;
  pcVar3 = GetHomeOutputDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar3,&local_39);
  bVar1 = LoadCache(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar3 = GetHomeOutputDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar3,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::operator+=(local_70,"/CMakeCache.txt");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar1) {
      cmSystemTools::Error
                ("There is a CMakeCache.txt file for the current binary tree but cmake does not have permission to read it. Please check the permissions of the directory you are trying to run CMake on."
                 ,(char *)0x0,(char *)0x0,(char *)0x0);
      this_local._4_4_ = -1;
    }
    std::__cxx11::string::~string(local_70);
    if (bVar1) {
      return this_local._4_4_;
    }
  }
  iVar2 = AddCMakePaths(this);
  if (iVar2 == 0) {
    this_local._4_4_ = -3;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::LoadCache()
{
  // could we not read the cache
  if (!this->LoadCache(this->GetHomeOutputDirectory()))
    {
    // if it does exist, but isn't readable then warn the user
    std::string cacheFile = this->GetHomeOutputDirectory();
    cacheFile += "/CMakeCache.txt";
    if(cmSystemTools::FileExists(cacheFile.c_str()))
      {
      cmSystemTools::Error(
        "There is a CMakeCache.txt file for the current binary tree but "
        "cmake does not have permission to read it. Please check the "
        "permissions of the directory you are trying to run CMake on.");
      return -1;
      }
    }

  // setup CMAKE_ROOT and CMAKE_COMMAND
  if(!this->AddCMakePaths())
    {
    return -3;
    }
  return 0;
}